

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAssemblerLabel.cpp
# Opt level: O3

void __thiscall CAssemblerLabel::writeTempData(CAssemblerLabel *this,TempData *tempData)

{
  element_type *args;
  int64_t memoryAddress;
  iterator iVar1;
  string local_38;
  
  iVar1 = std::
          _Rb_tree<Identifier,_Identifier,_std::_Identity<Identifier>,_std::less<Identifier>,_std::allocator<Identifier>_>
          ::find(&Global.symbolTable.generatedLabels._M_t,
                 &((this->label).super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name
                );
  if ((_Rb_tree_header *)iVar1._M_node ==
      &Global.symbolTable.generatedLabels._M_t._M_impl.super__Rb_tree_header) {
    args = (this->label).super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    memoryAddress = args->value;
    tinyformat::format<Identifier>(&local_38,"%s:",&args->name);
    TempData::writeLine(tempData,memoryAddress,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void CAssemblerLabel::writeTempData(TempData& tempData) const
{
	if (!Global.symbolTable.isGeneratedLabel(label->getName()))
		tempData.writeLine(label->getValue(),tfm::format("%s:",label->getName()));
}